

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::computeVertexPrincipalCurvatureDirections
          (ExtrinsicGeometryInterface *this)

{
  Vector2 *pVVar1;
  Vector2 VVar2;
  bool bVar3;
  SurfaceMesh *pSVar4;
  size_t sVar5;
  pointer puVar6;
  double *pdVar7;
  double *pdVar8;
  Vector2 *pVVar9;
  Vector2 *pVVar10;
  unsigned_long uVar11;
  undefined1 auVar12 [16];
  long lVar13;
  size_t i_1;
  size_t sVar14;
  size_t sVar15;
  ulong uVar16;
  unsigned_long uVar17;
  unsigned_long *puVar18;
  size_t i;
  unsigned_long uVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2> local_70;
  
  if ((this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.computed ==
      false) {
    if ((this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.evaluateFunc.
        super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001e470c;
    (*(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.evaluateFunc.
      _M_invoker)((_Any_data *)
                  &(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.
                   evaluateFunc);
    (this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.computed = true;
  }
  if ((this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.super_DependentQuantity.
      computed == false) {
    if ((this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.super_DependentQuantity.
        evaluateFunc.super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001e470c;
    (*(this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.super_DependentQuantity.
      evaluateFunc._M_invoker)
              ((_Any_data *)
               &(this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.
                super_DependentQuantity.evaluateFunc);
    (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.super_DependentQuantity.
    computed = true;
  }
  if ((this->edgeDihedralAnglesQ).super_DependentQuantity.computed == false) {
    if ((this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
LAB_001e470c:
      ::std::__throw_bad_function_call();
    }
    (*(this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc);
    (this->edgeDihedralAnglesQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::MeshData
            (&local_70,(this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::operator=
            (&this->vertexPrincipalCurvatureDirections,&local_70);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::~MeshData(&local_70);
  pSVar4 = (this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh;
  sVar5 = pSVar4->nVerticesFillCount;
  if ((sVar5 == 0) ||
     (puVar6 = (pSVar4->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar6 != 0xffffffffffffffff)) {
    sVar14 = 0;
  }
  else {
    sVar15 = 0;
    do {
      sVar14 = sVar5;
      if (sVar5 - 1 == sVar15) break;
      sVar14 = sVar15 + 1;
      lVar13 = sVar15 + 1;
      sVar15 = sVar14;
    } while (puVar6[lVar13] == 0xffffffffffffffff);
  }
  if (sVar14 != sVar5) {
    puVar6 = (pSVar4->vHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = pSVar4->useImplicitTwinFlag;
    pdVar7 = (this->super_IntrinsicGeometryInterface).edgeLengths.data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pdVar8 = (this->edgeDihedralAngles).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pVVar9 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pVVar10 = (this->vertexPrincipalCurvatureDirections).data.
              super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    do {
      uVar11 = puVar6[sVar14];
      dVar21 = 0.0;
      dVar22 = 0.0;
      uVar19 = uVar11;
      do {
        if (bVar3 == false) {
          uVar16 = (pSVar4->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19];
          uVar17 = (pSVar4->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19];
        }
        else {
          uVar16 = uVar19 >> 1;
          uVar17 = uVar19 >> 1;
        }
        dVar23 = 1.0 / pdVar7[uVar16];
        VVar2 = pVVar9[uVar19];
        auVar25._0_8_ = -pVVar9[uVar19].y;
        auVar25._8_8_ = 0x8000000000000000;
        auVar20 = vshufpd_avx((undefined1  [16])VVar2,auVar25,1);
        auVar12 = vshufpd_avx((undefined1  [16])VVar2,(undefined1  [16])VVar2,1);
        auVar26._0_8_ = auVar12._0_8_ * auVar20._0_8_;
        auVar26._8_8_ = auVar12._8_8_ * auVar20._8_8_;
        auVar20._8_8_ = pVVar9[uVar19].x;
        auVar20._0_8_ = pVVar9[uVar19].x;
        auVar20 = vfnmadd231pd_avx512vl(auVar26,(undefined1  [16])VVar2,auVar20);
        auVar24._0_8_ = dVar23 * auVar20._0_8_;
        auVar24._8_8_ = dVar23 * auVar20._8_8_;
        dVar23 = pdVar8[uVar17];
        auVar12._8_8_ = dVar23;
        auVar12._0_8_ = dVar23;
        auVar20 = vmulpd_avx512vl(auVar24,auVar12);
        dVar21 = dVar21 + auVar20._0_8_;
        dVar22 = dVar22 + auVar20._8_8_;
        puVar18 = (pSVar4->heNextArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + (uVar19 ^ 1);
        if (bVar3 == false) {
          puVar18 = (pSVar4->heVertOutNextArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar19;
        }
        uVar19 = *puVar18;
      } while (uVar19 != uVar11);
      pVVar1 = pVVar10 + sVar14;
      pVVar1->x = dVar21 * 0.25;
      pVVar1->y = dVar22 * 0.25;
      sVar15 = sVar14;
      do {
        sVar14 = sVar5;
        if (sVar5 - 1 == sVar15) break;
        sVar14 = sVar15 + 1;
        lVar13 = sVar15 + 1;
        sVar15 = sVar14;
      } while (puVar6[lVar13] == 0xffffffffffffffff);
    } while (sVar14 != sVar5);
  }
  return;
}

Assistant:

void ExtrinsicGeometryInterface::computeVertexPrincipalCurvatureDirections() {
  edgeLengthsQ.ensureHave();
  halfedgeVectorsInVertexQ.ensureHave();
  edgeDihedralAnglesQ.ensureHave();

  vertexPrincipalCurvatureDirections = VertexData<Vector2>(mesh);

  for (Vertex v : mesh.vertices()) {
    Vector2 principalDir{0.0, 0.0};
    for (Halfedge he : v.outgoingHalfedges()) {
      double len = edgeLengths[he.edge()];
      double alpha = edgeDihedralAngles[he.edge()];
      Vector2 vec = halfedgeVectorsInVertex[he];
      principalDir += -vec * vec / len * alpha;
    }

    vertexPrincipalCurvatureDirections[v] = principalDir / 4;
  }
}